

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::Petition
          (CommissionerImpl *this,PetitionHandler *aHandler,string *aAddr,uint16_t aPort)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  __0 *this_00;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  allocator local_189;
  writer write;
  string local_170;
  Error error;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  undefined1 local_100 [40];
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  local_d8;
  anon_class_40_2_3adf01b8 onConnected;
  undefined1 local_90 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function(&onConnected.aHandler,aHandler);
  onConnected.this = this;
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_100,"meshcop",&local_189);
    local_68.types_[0] = string_type;
    local_68.types_[1] = uint_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "starting petition: border agent = ({}, {})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2a;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    local_68.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "starting petition: border agent = ({}, {})";
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_68;
    local_68.context_.types_ = local_68.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
          ::writer::operator()((writer *)&write,pcVar3,"");
          goto LAB_001921e6;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
      ::writer::operator()((writer *)&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                         (pcVar4,"",&local_68);
    }
LAB_001921e6:
    local_68.types_ = (type  [2])(aAddr->_M_dataplus)._M_p;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)aAddr->_M_string_length;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    fmt.size_ = 0x2d;
    fmt.data_ = (char *)0x2a;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = (ulong)aPort;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_170,(v10 *)"starting petition: border agent = ({}, {})",fmt,args_00);
    Log(kDebug,(string *)local_100,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)local_100);
    if ((this->mBrClient).mDtlsSession.mState == kConnected) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
      ::function(&local_d8,aHandler);
      SendPetition(this,&local_d8);
      std::_Function_base::~_Function_base(&local_d8.super__Function_base);
    }
    else {
      local_118 = (code *)0x0;
      pcStack_110 = (code *)0x0;
      local_128._M_unused._M_object = (void *)0x0;
      local_128._8_8_ = 0;
      this_00 = (__0 *)operator_new(0x28);
      Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
      ::$_0::__0(this_00,&onConnected);
      pcStack_110 = std::
                    _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:267:24)>
                    ::_M_invoke;
      local_118 = std::
                  _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:267:24)>
                  ::_M_manager;
      local_128._M_unused._0_8_ = (undefined8)this_00;
      (*(this->super_Commissioner)._vptr_Commissioner[4])(this,&local_128,aAddr,(ulong)aPort);
      std::_Function_base::~_Function_base((_Function_base *)&local_128);
    }
  }
  else {
    local_68.types_ = (type  [2])((ulong)local_68.types_[1] << 0x20);
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot petition when the commissioner is running";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x30;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "cannot petition when the commissioner is running";
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_68;
    local_68.context_.types_ = local_68.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar3,"");
          goto LAB_0019216f;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_68);
    }
LAB_0019216f:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_170,(v10 *)"cannot petition when the commissioner is running",
               (string_view)ZEXT816(0x30),args);
    local_100._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_100 + 8),(string *)&local_170);
    Error::operator=(&error,(Error *)local_100);
    std::__cxx11::string::~string((string *)(local_100 + 8));
    std::__cxx11::string::~string((string *)&local_170);
  }
  if (error.mCode != kNone) {
    Error::Error((Error *)local_90,&error);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
    ::operator()(aHandler,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,
                 (Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onConnected);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::Petition(PetitionHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    Error error;

    auto onConnected = [&, aHandler](Error aError) {
        if (aError != ErrorCode::kNone)
        {
            aHandler(nullptr, aError);
        }
        else
        {
            LOG_DEBUG(LOG_REGION_MESHCOP, "DTLS connection to border agent succeed");
            this->mState = State::kConnected;
            SendPetition(aHandler);
        }
    };

    VerifyOrExit(!IsActive(), error = ERROR_INVALID_STATE("cannot petition when the commissioner is running"));
    LOG_DEBUG(LOG_REGION_MESHCOP, "starting petition: border agent = ({}, {})", aAddr, aPort);

    if (mBrClient.IsConnected())
    {
        SendPetition(aHandler);
    }
    else
    {
        Connect(onConnected, aAddr, aPort);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}